

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O1

ggml_type kv_cache_type_from_str(string *s)

{
  pointer pgVar1;
  int iVar2;
  runtime_error *this;
  ggml_type unaff_EBP;
  pointer pgVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  pgVar1 = kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pgVar3 = kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar4 = kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (!bVar4) {
    ggml_type_name(*kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl
                    .super__Vector_impl_data._M_start);
    iVar2 = std::__cxx11::string::compare((char *)s);
    unaff_EBP = *pgVar3;
    if (iVar2 != 0) {
      do {
        pgVar3 = pgVar3 + 1;
        bVar4 = pgVar3 == pgVar1;
        if (bVar4) goto LAB_001610b7;
        ggml_type_name(*pgVar3);
        iVar2 = std::__cxx11::string::compare((char *)s);
      } while (iVar2 != 0);
      unaff_EBP = *pgVar3;
    }
  }
LAB_001610b7:
  if (!bVar4) {
    return unaff_EBP;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_48,"Unsupported cache type: ",s);
  std::runtime_error::runtime_error(this,(string *)&bStack_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static ggml_type kv_cache_type_from_str(const std::string & s) {
    for (const auto & type : kv_cache_types) {
        if (ggml_type_name(type) == s) {
            return type;
        }
    }
    throw std::runtime_error("Unsupported cache type: " + s);
}